

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

void __thiscall trng::xoshiro256plus::status_type::status_type(void *param_1,int param_2)

{
  byte bVar1;
  result_type mask;
  status_type local_a0;
  status_type local_80;
  status_type local_60;
  status_type local_40;
  undefined8 local_20;
  int local_14;
  void *local_10;
  
  local_14 = param_2;
  local_10 = param_1;
  memset(param_1,0,0x20);
  status_type((status_type *)param_1);
  local_20 = 0x8000000000000000;
  bVar1 = (byte)local_14;
  if (local_14 < 0x40) {
    status_type(&local_40,0x8000000000000000 >> (bVar1 & 0x3f),0,0,0);
    *(result_type *)param_1 = local_40.r[0];
    *(result_type *)((long)param_1 + 8) = local_40.r[1];
    *(result_type *)((long)param_1 + 0x10) = local_40.r[2];
    *(result_type *)((long)param_1 + 0x18) = local_40.r[3];
  }
  else if (local_14 < 0x80) {
    status_type(&local_60,0,0x8000000000000000 >> (bVar1 - 0x40 & 0x3f),0,0);
    *(result_type *)param_1 = local_60.r[0];
    *(result_type *)((long)param_1 + 8) = local_60.r[1];
    *(result_type *)((long)param_1 + 0x10) = local_60.r[2];
    *(result_type *)((long)param_1 + 0x18) = local_60.r[3];
  }
  else if (local_14 < 0xc0) {
    status_type(&local_80,0,0,0x8000000000000000 >> (bVar1 + 0x80 & 0x3f),0);
    *(result_type *)param_1 = local_80.r[0];
    *(result_type *)((long)param_1 + 8) = local_80.r[1];
    *(result_type *)((long)param_1 + 0x10) = local_80.r[2];
    *(result_type *)((long)param_1 + 0x18) = local_80.r[3];
  }
  else {
    status_type(&local_a0,0,0,0,0x8000000000000000 >> (bVar1 + 0x40 & 0x3f));
    *(result_type *)param_1 = local_a0.r[0];
    *(result_type *)((long)param_1 + 8) = local_a0.r[1];
    *(result_type *)((long)param_1 + 0x10) = local_a0.r[2];
    *(result_type *)((long)param_1 + 0x18) = local_a0.r[3];
  }
  return;
}

Assistant:

explicit status_type(int i, eye) : status_type() {
        const result_type mask{result_type(1) << 63};
        if (i < 64)
          *this = status_type{mask >> i, 0, 0, 0};
        else if (i < 2 * 64)
          *this = status_type{0, mask >> (i - 64), 0, 0};
        else if (i < 3 * 64)
          *this = status_type{0, 0, mask >> (i - 2 * 64), 0};
        else
          *this = status_type{0, 0, 0, mask >> (i - 3 * 64)};
      }